

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

Type __thiscall wasm::Literals::getType(Literals *this)

{
  bool bVar1;
  size_t sVar2;
  Literal *pLVar3;
  Iterator IVar4;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar5;
  Tuple local_88;
  value_type *local_70;
  value_type *val;
  Iterator __end2;
  undefined1 local_48 [8];
  Iterator __begin2;
  Literals *__range2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  Literals *this_local;
  
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  bVar1 = SmallVector<wasm::Literal,_1UL>::empty(&this->super_SmallVector<wasm::Literal,_1UL>);
  if (bVar1) {
    Type::Type((Type *)&this_local,none);
  }
  else {
    sVar2 = SmallVector<wasm::Literal,_1UL>::size(&this->super_SmallVector<wasm::Literal,_1UL>);
    if (sVar2 == 1) {
      pLVar3 = SmallVector<wasm::Literal,_1UL>::operator[]
                         (&this->super_SmallVector<wasm::Literal,_1UL>,0);
      this_local = (Literals *)(pLVar3->type).id;
    }
    else {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
      __begin2.
      super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
      .index = (size_t)this;
      IVar4 = SmallVector<wasm::Literal,_1UL>::begin(&this->super_SmallVector<wasm::Literal,_1UL>);
      __begin2.
      super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
      .parent = (SmallVector<wasm::Literal,_1UL> *)
                IVar4.
                super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                .index;
      local_48 = (undefined1  [8])
                 IVar4.
                 super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                 .parent;
      IVar5 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
               )SmallVector<wasm::Literal,_1UL>::end
                          ((SmallVector<wasm::Literal,_1UL> *)
                           __begin2.
                           super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                           .index);
      while( true ) {
        __end2.
        super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        .parent = (SmallVector<wasm::Literal,_1UL> *)IVar5.index;
        val = (value_type *)IVar5.parent;
        bVar1 = SmallVector<wasm::Literal,_1UL>::
                IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                ::operator!=((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                              *)local_48,(Iterator *)&val);
        if (!bVar1) break;
        local_70 = SmallVector<wasm::Literal,_1UL>::Iterator::operator*((Iterator *)local_48);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2,&local_70->type);
        SmallVector<wasm::Literal,_1UL>::
        IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
        ::operator++((IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                      *)local_48);
        IVar5.index = (size_t)__end2.
                              super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                              .parent;
        IVar5.parent = (SmallVector<wasm::Literal,_1UL> *)val;
      }
      Tuple::Tuple(&local_88,(TypeList *)&__range2);
      ::wasm::Type::Type((Type *)&this_local,&local_88);
      Tuple::~Tuple(&local_88);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range2);
    }
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type getType() {
    if (empty()) {
      return Type::none;
    }
    if (size() == 1) {
      return (*this)[0].type;
    }
    std::vector<Type> types;
    for (auto& val : *this) {
      types.push_back(val.type);
    }
    return Type(types);
  }